

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int CVodeSensInit(void *cvode_mem,int Ns,int ism,CVSensRhsFn fS,N_Vector *yS0)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  SUNNonlinearSolver NLS;
  ulong uVar8;
  long lVar9;
  int error_code;
  ulong uVar10;
  char *msgfmt;
  size_t __size;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar14;
  long lVar13;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar14 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar4 = 0x581;
  }
  else if (*(int *)((long)cvode_mem + 0x860) == 0) {
    if (Ns < 1) {
      msgfmt = "NS <= 0 illegal.";
      iVar14 = -0x16;
      error_code = -0x16;
      iVar4 = 0x593;
    }
    else {
      *(int *)((long)cvode_mem + 0x90) = Ns;
      if (ism == 3) {
        msgfmt = "Illegal ism = CV_STAGGERED1 for CVodeSensInit.";
        iVar14 = -0x16;
        error_code = -0x16;
        iVar4 = 0x59d;
      }
      else if (ism - 3U < 0xfffffffe) {
        msgfmt = 
        "Illegal value for ism. Legal values are: CV_SIMULTANEOUS, CV_STAGGERED and CV_STAGGERED1.";
        iVar14 = -0x16;
        error_code = -0x16;
        iVar4 = 0x5a6;
      }
      else {
        *(int *)((long)cvode_mem + 0x94) = ism;
        if (yS0 == (N_Vector *)0x0) {
          msgfmt = "yS0 = NULL illegal.";
          iVar14 = -0x16;
          error_code = -0x16;
          iVar4 = 0x5b0;
        }
        else {
          *(undefined4 *)((long)cvode_mem + 0xb4) = 2;
          *(undefined8 *)((long)cvode_mem + 0xa0) = 0;
          if (fS == (CVSensRhsFn)0x0) {
            *(undefined4 *)((long)cvode_mem + 0xb0) = 1;
            *(code **)((long)cvode_mem + 0x98) = cvSensRhsInternalDQ;
            pvVar5 = cvode_mem;
          }
          else {
            *(undefined4 *)((long)cvode_mem + 0xb0) = 0;
            *(CVSensRhsFn *)((long)cvode_mem + 0x98) = fS;
            pvVar5 = *(void **)((long)cvode_mem + 0x18);
          }
          *(void **)((long)cvode_mem + 0xa8) = pvVar5;
          *(undefined4 *)((long)cvode_mem + 0x318) = 0;
          iVar4 = cvSensAllocVectors((CVodeMem)cvode_mem,*yS0);
          if (iVar4 != 0) {
            if (Ns != 1) {
              free(*(void **)((long)cvode_mem + 0xa50));
              *(undefined8 *)((long)cvode_mem + 0xa50) = 0;
              free(*(void **)((long)cvode_mem + 0xa58));
              *(undefined8 *)((long)cvode_mem + 0xa58) = 0;
              free(*(void **)((long)cvode_mem + 0xa60));
              *(undefined8 *)((long)cvode_mem + 0xa60) = 0;
              __size = (ulong)(uint)(Ns * 0xd) << 3;
              pvVar5 = malloc(__size);
              *(void **)((long)cvode_mem + 0xa50) = pvVar5;
              pvVar6 = malloc(__size);
              *(void **)((long)cvode_mem + 0xa58) = pvVar6;
              pvVar7 = malloc(__size);
              *(void **)((long)cvode_mem + 0xa60) = pvVar7;
              if ((pvVar5 == (void *)0x0) || (pvVar6 == (void *)0x0 || pvVar7 == (void *)0x0)) {
                cvSensFreeVectors((CVodeMem)cvode_mem);
                msgfmt = "A memory request failed.";
                iVar14 = -0x14;
                error_code = -0x14;
                iVar4 = 0x5e7;
                goto LAB_001145a2;
              }
            }
            auVar3 = _DAT_00138040;
            lVar1 = *(long *)((long)cvode_mem + 0xa50);
            uVar8 = 1;
            if (1 < Ns) {
              uVar8 = (ulong)(uint)Ns;
            }
            lVar9 = uVar8 - 1;
            auVar11._8_4_ = (int)lVar9;
            auVar11._0_8_ = lVar9;
            auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
            lVar9 = 0;
            auVar11 = auVar11 ^ _DAT_00138040;
            auVar12 = _DAT_00138030;
            do {
              bVar2 = auVar11._0_4_ < SUB164(auVar12 ^ auVar3,0);
              iVar4 = auVar11._4_4_;
              iVar14 = SUB164(auVar12 ^ auVar3,4);
              if ((bool)(~(iVar4 < iVar14 || iVar14 == iVar4 && bVar2) & 1)) {
                *(undefined8 *)(lVar1 + lVar9) = 0x3ff0000000000000;
              }
              if (iVar4 >= iVar14 && (iVar14 != iVar4 || !bVar2)) {
                *(undefined8 *)(lVar1 + 8 + lVar9) = 0x3ff0000000000000;
              }
              lVar13 = auVar12._8_8_;
              auVar12._0_8_ = auVar12._0_8_ + 2;
              auVar12._8_8_ = lVar13 + 2;
              lVar9 = lVar9 + 0x10;
            } while ((ulong)((int)uVar8 + 1U & 0xfffffffe) << 3 != lVar9);
            iVar4 = N_VScaleVectorArray(Ns,*(undefined8 *)((long)cvode_mem + 0xa50),yS0,
                                        *(undefined8 *)((long)cvode_mem + 0x288));
            if (iVar4 != 0) {
              return -0x1c;
            }
            uVar8 = 0;
            *(undefined8 *)((long)cvode_mem + 0x668) = 0;
            *(undefined8 *)((long)cvode_mem + 0x6b8) = 0;
            *(undefined8 *)((long)cvode_mem + 0x680) = 0;
            *(undefined8 *)((long)cvode_mem + 0x698) = 0;
            *(undefined8 *)((long)cvode_mem + 0x6d0) = 0;
            *(undefined1 (*) [16])((long)cvode_mem + 0x640) = (undefined1  [16])0x0;
            lVar1 = *(long *)((long)cvode_mem + 0xc0);
            lVar9 = *(long *)((long)cvode_mem + 200);
            uVar10 = 1;
            if (1 < Ns) {
              uVar10 = (ulong)(uint)Ns;
            }
            do {
              *(int *)(lVar9 + uVar8 * 4) = (int)uVar8;
              *(undefined8 *)(lVar1 + uVar8 * 8) = 0x3ff0000000000000;
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
            *(undefined4 *)((long)cvode_mem + 0x8c) = 1;
            *(undefined4 *)((long)cvode_mem + 0x860) = 1;
            NLS = SUNNonlinSol_NewtonSens
                            ((uint)(ism == 1) + Ns,*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem
                            );
            if (NLS != (SUNNonlinearSolver)0x0) {
              if (ism == 1) {
                iVar4 = CVodeSetNonlinearSolverSensSim(cvode_mem,NLS);
              }
              else {
                iVar4 = CVodeSetNonlinearSolverSensStg(cvode_mem,NLS);
              }
              if (iVar4 != 0) {
                cvProcessError((CVodeMem)cvode_mem,iVar4,0x62c,"CVodeSensInit",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"Setting the nonlinear solver failed");
                cvSensFreeVectors((CVodeMem)cvode_mem);
                SUNNonlinSolFree(NLS);
                return -0x14;
              }
              if (ism == 1) {
                *(undefined4 *)((long)cvode_mem + 0x740) = 1;
              }
              else {
                *(undefined4 *)((long)cvode_mem + 0x750) = 1;
              }
              return 0;
            }
            cvProcessError((CVodeMem)cvode_mem,-0x14,0x61c,"CVodeSensInit",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                           ,"A memory request failed.");
            cvSensFreeVectors((CVodeMem)cvode_mem);
            return -0x14;
          }
          msgfmt = "A memory request failed.";
          iVar14 = -0x14;
          error_code = -0x14;
          iVar4 = 0x5d0;
        }
      }
    }
  }
  else {
    msgfmt = "Sensitivity analysis already initialized.";
    iVar14 = -0x16;
    error_code = -0x16;
    iVar4 = 0x58a;
  }
LAB_001145a2:
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar4,"CVodeSensInit",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar14;
}

Assistant:

int CVodeSensInit(void* cvode_mem, int Ns, int ism, CVSensRhsFn fS, N_Vector* yS0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  int is, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if CVodeSensInit or CVodeSensInit1 was already called */

  if (cv_mem->cv_SensMallocDone)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_SENSINIT_2);
    return (CV_ILL_INPUT);
  }

  /* Check if Ns is legal */

  if (Ns <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NS);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_Ns = Ns;

  /* Check if ism is compatible */

  if (ism == CV_STAGGERED1)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM_IFS);
    return (CV_ILL_INPUT);
  }

  /* Check if ism is legal */

  if ((ism != CV_SIMULTANEOUS) && (ism != CV_STAGGERED))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_ism = ism;

  /* Check if yS0 is non-null */

  if (yS0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_YS0);
    return (CV_ILL_INPUT);
  }

  /* Store sensitivity RHS-related data */

  cv_mem->cv_ifS = CV_ALLSENS;
  cv_mem->cv_fS1 = NULL;

  if (fS == NULL)
  {
    cv_mem->cv_fSDQ    = SUNTRUE;
    cv_mem->cv_fS      = cvSensRhsInternalDQ;
    cv_mem->cv_fS_data = cvode_mem;
  }
  else
  {
    cv_mem->cv_fSDQ    = SUNFALSE;
    cv_mem->cv_fS      = fS;
    cv_mem->cv_fS_data = cv_mem->cv_user_data;
  }

  /* No memory allocation for STAGGERED1 */

  cv_mem->cv_stgr1alloc = SUNFALSE;

  /* Allocate the vectors (using yS0[0] as a template) */

  allocOK = cvSensAllocVectors(cv_mem, yS0[0]);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Check if larger temporary work arrays are needed for fused vector ops */
  if (Ns * L_MAX > L_MAX)
  {
    free(cv_mem->cv_cvals);
    cv_mem->cv_cvals = NULL;
    free(cv_mem->cv_Xvecs);
    cv_mem->cv_Xvecs = NULL;
    free(cv_mem->cv_Zvecs);
    cv_mem->cv_Zvecs = NULL;

    cv_mem->cv_cvals = (sunrealtype*)malloc((Ns * L_MAX) * sizeof(sunrealtype));
    cv_mem->cv_Xvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));
    cv_mem->cv_Zvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));

    if ((cv_mem->cv_cvals == NULL) || (cv_mem->cv_Xvecs == NULL) ||
        (cv_mem->cv_Zvecs == NULL))
    {
      cvSensFreeVectors(cv_mem);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }
  }

  /*----------------------------------------------
    All error checking is complete at this point
    -----------------------------------------------*/

  /* Initialize znS[0] in the history array */

  for (is = 0; is < Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

  retval = N_VScaleVectorArray(Ns, cv_mem->cv_cvals, yS0, cv_mem->cv_znS[0]);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* Initialize all sensitivity related counters */

  cv_mem->cv_nfSe     = 0;
  cv_mem->cv_nfeS     = 0;
  cv_mem->cv_ncfnS    = 0;
  cv_mem->cv_netfS    = 0;
  cv_mem->cv_nniS     = 0;
  cv_mem->cv_nnfS     = 0;
  cv_mem->cv_nsetupsS = 0;

  /* Set default values for plist and pbar */

  for (is = 0; is < Ns; is++)
  {
    cv_mem->cv_plist[is] = is;
    cv_mem->cv_pbar[is]  = ONE;
  }

  /* Sensitivities will be computed */

  cv_mem->cv_sensi          = SUNTRUE;
  cv_mem->cv_SensMallocDone = SUNTRUE;

  /* create a Newton nonlinear solver object by default */
  if (ism == CV_SIMULTANEOUS)
  {
    NLS = SUNNonlinSol_NewtonSens(Ns + 1, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }
  else
  {
    NLS = SUNNonlinSol_NewtonSens(Ns, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }

  /* check that the nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvSensFreeVectors(cv_mem);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  if (ism == CV_SIMULTANEOUS)
  {
    retval = CVodeSetNonlinearSolverSensSim(cv_mem, NLS);
  }
  else { retval = CVodeSetNonlinearSolverSensStg(cv_mem, NLS); }

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvSensFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  if (ism == CV_SIMULTANEOUS) { cv_mem->ownNLSsim = SUNTRUE; }
  else { cv_mem->ownNLSstg = SUNTRUE; }

  /* Sensitivity initialization was successfull */
  return (CV_SUCCESS);
}